

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_sub_integer_into(mp_int *r,mp_int *a,uintmax_t n)

{
  BignumCarry in_stack_00000008;
  
  mp_add_masked_integer_into(r->w,r->nw,a,n,0xffffffffffffffff,1,in_stack_00000008);
  return;
}

Assistant:

void mp_sub_integer_into(mp_int *r, mp_int *a, uintmax_t n)
{
    mp_add_masked_integer_into(r->w, r->nw, a, n,
                               ~(BignumInt)0, ~(BignumInt)0, 1);
}